

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O1

void __thiscall
slang::driver::SourceLoader::addSearchExtension(SourceLoader *this,string_view extension)

{
  flat_hash_set<std::string_view> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  ulong uVar3;
  ulong uVar4;
  value_type_pointer pbVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  value_type_pointer pbVar22;
  ulong uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  int iVar40;
  uint64_t hash;
  uint uVar41;
  value_type_pointer pbVar42;
  group_type_pointer pgVar43;
  size_t len;
  ulong uVar44;
  size_t sVar45;
  ulong uVar46;
  ulong pos0;
  long lVar47;
  ulong uVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  locator res;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  ulong local_90;
  ulong local_88;
  size_t local_80;
  ulong local_78;
  value_type_pointer local_70;
  group_type_pointer local_68;
  char *local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  locator local_48;
  
  local_a0._M_str = extension._M_str;
  len = extension._M_len;
  arrays_ = &this->uniqueExtensions;
  local_a0._M_len = len;
  local_60 = local_a0._M_str;
  hash = detail::hashing::hash(local_a0._M_str,len);
  pos0 = hash >> ((byte)(this->uniqueExtensions).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar43 = (this->uniqueExtensions).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .arrays.groups_;
  lVar47 = (hash & 0xff) * 4;
  uVar51 = (&UNK_0046cabc)[lVar47];
  uVar52 = (&UNK_0046cabd)[lVar47];
  uVar53 = (&UNK_0046cabe)[lVar47];
  uVar54 = (&UNK_0046cabf)[lVar47];
  uVar44 = (ulong)((uint)hash & 7);
  sVar45 = (this->uniqueExtensions).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
           .arrays.groups_size_mask;
  uVar46 = 0;
  pbVar42 = (this->uniqueExtensions).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .arrays.elements_;
  uVar48 = pos0;
  uVar55 = uVar51;
  uVar56 = uVar52;
  uVar57 = uVar53;
  uVar58 = uVar54;
  uVar59 = uVar51;
  uVar60 = uVar52;
  uVar61 = uVar53;
  uVar62 = uVar54;
  uVar63 = uVar51;
  uVar64 = uVar52;
  uVar65 = uVar53;
  uVar66 = uVar54;
  do {
    pgVar2 = pgVar43 + uVar48;
    auVar50[0] = -(pgVar2->m[0].n == uVar51);
    auVar50[1] = -(pgVar2->m[1].n == uVar52);
    auVar50[2] = -(pgVar2->m[2].n == uVar53);
    auVar50[3] = -(pgVar2->m[3].n == uVar54);
    auVar50[4] = -(pgVar2->m[4].n == uVar55);
    auVar50[5] = -(pgVar2->m[5].n == uVar56);
    auVar50[6] = -(pgVar2->m[6].n == uVar57);
    auVar50[7] = -(pgVar2->m[7].n == uVar58);
    auVar50[8] = -(pgVar2->m[8].n == uVar59);
    auVar50[9] = -(pgVar2->m[9].n == uVar60);
    auVar50[10] = -(pgVar2->m[10].n == uVar61);
    auVar50[0xb] = -(pgVar2->m[0xb].n == uVar62);
    auVar50[0xc] = -(pgVar2->m[0xc].n == uVar63);
    auVar50[0xd] = -(pgVar2->m[0xd].n == uVar64);
    auVar50[0xe] = -(pgVar2->m[0xe].n == uVar65);
    auVar50[0xf] = -(pgVar2->m[0xf].n == uVar66);
    pbVar22 = pbVar42;
    uVar23 = uVar48;
    uVar24 = uVar51;
    uVar25 = uVar52;
    uVar26 = uVar53;
    uVar27 = uVar54;
    uVar28 = uVar55;
    uVar29 = uVar56;
    uVar30 = uVar57;
    uVar31 = uVar58;
    uVar32 = uVar59;
    uVar33 = uVar60;
    uVar34 = uVar61;
    uVar35 = uVar62;
    uVar36 = uVar63;
    uVar37 = uVar64;
    uVar38 = uVar65;
    uVar39 = uVar66;
    uVar3 = local_90;
    uVar4 = local_88;
    pbVar5 = local_70;
    uVar6 = local_58;
    uVar7 = uStack_57;
    uVar8 = uStack_56;
    uVar9 = uStack_55;
    uVar10 = uStack_54;
    uVar11 = uStack_53;
    uVar12 = uStack_52;
    uVar13 = uStack_51;
    uVar14 = uStack_50;
    uVar15 = uStack_4f;
    uVar16 = uStack_4e;
    uVar17 = uStack_4d;
    uVar18 = uStack_4c;
    uVar19 = uStack_4b;
    uVar20 = uStack_4a;
    uVar21 = uStack_49;
    for (uVar41 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe); uStack_49 = uVar39,
        uStack_4a = uVar38, uStack_4b = uVar37, uStack_4c = uVar36, uStack_4d = uVar35,
        uStack_4e = uVar34, uStack_4f = uVar33, uStack_50 = uVar32, uStack_51 = uVar31,
        uStack_52 = uVar30, uStack_53 = uVar29, uStack_54 = uVar28, uStack_55 = uVar27,
        uStack_56 = uVar26, uStack_57 = uVar25, local_58 = uVar24, local_90 = uVar23,
        local_88 = uVar46, local_70 = pbVar22, uVar41 != 0; uVar41 = uVar41 - 1 & uVar41) {
      iVar40 = 0;
      if (uVar41 != 0) {
        for (; (uVar41 >> iVar40 & 1) == 0; iVar40 = iVar40 + 1) {
        }
      }
      bVar49 = *(size_t *)((long)&pbVar42[uVar48 * 0xf]._M_len + (ulong)(uint)(iVar40 << 4)) == len;
      lVar47 = (long)&pbVar42[uVar48 * 0xf]._M_len + (ulong)(uint)(iVar40 << 4);
      local_80 = sVar45;
      local_78 = uVar44;
      local_68 = pgVar43;
      if (bVar49 && len != 0) {
        iVar40 = bcmp(local_60,*(void **)(lVar47 + 8),len);
        bVar49 = iVar40 == 0;
        uVar51 = local_58;
        uVar52 = uStack_57;
        uVar53 = uStack_56;
        uVar54 = uStack_55;
        uVar55 = uStack_54;
        uVar56 = uStack_53;
        uVar57 = uStack_52;
        uVar58 = uStack_51;
        uVar59 = uStack_50;
        uVar60 = uStack_4f;
        uVar61 = uStack_4e;
        uVar62 = uStack_4d;
        uVar63 = uStack_4c;
        uVar64 = uStack_4b;
        uVar65 = uStack_4a;
        uVar66 = uStack_49;
      }
      if (bVar49) goto LAB_00138280;
      pbVar22 = local_70;
      pgVar43 = local_68;
      uVar44 = local_78;
      sVar45 = local_80;
      uVar46 = local_88;
      uVar23 = local_90;
      uVar24 = local_58;
      uVar25 = uStack_57;
      uVar26 = uStack_56;
      uVar27 = uStack_55;
      uVar28 = uStack_54;
      uVar29 = uStack_53;
      uVar30 = uStack_52;
      uVar31 = uStack_51;
      uVar32 = uStack_50;
      uVar33 = uStack_4f;
      uVar34 = uStack_4e;
      uVar35 = uStack_4d;
      uVar36 = uStack_4c;
      uVar37 = uStack_4b;
      uVar38 = uStack_4a;
      uVar39 = uStack_49;
      uVar3 = local_90;
      uVar4 = local_88;
      pbVar5 = local_70;
      uVar6 = local_58;
      uVar7 = uStack_57;
      uVar8 = uStack_56;
      uVar9 = uStack_55;
      uVar10 = uStack_54;
      uVar11 = uStack_53;
      uVar12 = uStack_52;
      uVar13 = uStack_51;
      uVar14 = uStack_50;
      uVar15 = uStack_4f;
      uVar16 = uStack_4e;
      uVar17 = uStack_4d;
      uVar18 = uStack_4c;
      uVar19 = uStack_4b;
      uVar20 = uStack_4a;
      uVar21 = uStack_49;
    }
    local_58 = uVar6;
    uStack_57 = uVar7;
    uStack_56 = uVar8;
    uStack_55 = uVar9;
    uStack_54 = uVar10;
    uStack_53 = uVar11;
    uStack_52 = uVar12;
    uStack_51 = uVar13;
    uStack_50 = uVar14;
    uStack_4f = uVar15;
    uStack_4e = uVar16;
    uStack_4d = uVar17;
    uStack_4c = uVar18;
    uStack_4b = uVar19;
    uStack_4a = uVar20;
    uStack_49 = uVar21;
    if ((pgVar43[uVar48].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar44]) == 0) break;
    uVar46 = local_88 + 1;
    uVar48 = local_90 + local_88 + 1 & sVar45;
    pbVar42 = local_70;
    local_90 = uVar3;
    local_88 = uVar4;
    local_70 = pbVar5;
  } while (uVar46 <= sVar45);
  lVar47 = 0;
  local_90 = uVar3;
  local_88 = uVar4;
  local_70 = pbVar5;
LAB_00138280:
  if (lVar47 == 0) {
    if ((this->uniqueExtensions).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        (this->uniqueExtensions).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_a0);
      psVar1 = &(this->uniqueExtensions).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)arrays_,hash,&local_a0);
    }
    std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                *)&this->searchExtensions,&local_a0);
  }
  return;
}

Assistant:

void SourceLoader::addSearchExtension(std::string_view extension) {
    if (uniqueExtensions.emplace(extension).second)
        searchExtensions.emplace_back(extension);
}